

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O2

void nn_req_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  ulong uVar1;
  char *pcVar2;
  int allow_delay;
  ulong uVar3;
  nn_req *self_00;
  undefined8 uVar4;
  
  self_00 = (nn_req *)&self[-10].stopped.item;
  if (self == (nn_fsm *)0x0) {
    self_00 = (nn_req *)0x0;
  }
  uVar3 = (ulong)(uint)src;
  switch(self_00->state) {
  case 1:
    if (src == -2) {
      if (type == -2) {
LAB_001178cd:
        self_00->state = 2;
        return;
      }
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected action";
      uVar3 = 0xfffffffffffffffe;
      uVar4 = 0x16e;
    }
    else {
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected source";
      uVar4 = 0x172;
    }
    goto LAB_00117e3a;
  case 2:
    if (src != -2) {
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected source";
      uVar4 = 0x186;
      goto LAB_00117e3a;
    }
    if (type != 4) {
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected action";
      uVar3 = 0xfffffffffffffffe;
      uVar4 = 0x182;
      goto LAB_00117e3a;
    }
    break;
  case 3:
    if (src != -2) {
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected source";
      uVar4 = 0x19e;
      goto LAB_00117e3a;
    }
    if (type == 4) {
      return;
    }
    if (type != 3) {
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected action";
      uVar3 = 0xfffffffffffffffe;
      uVar4 = 0x19a;
      goto LAB_00117e3a;
    }
    allow_delay = 0;
    goto LAB_0011794a;
  case 4:
    if (src == 1) {
      if (type == 1) {
LAB_001179d4:
        nn_timer_stop(&(self_00->task).timer);
        (self_00->task).sent_to = (nn_pipe *)0x0;
        self_00->state = 5;
        return;
      }
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected action";
      uVar3 = 1;
      uVar4 = 0x1cf;
    }
    else if (src == -2) {
      if (type == 6) goto LAB_001179d4;
      if (type == 4) {
        nn_timer_stop(&(self_00->task).timer);
        (self_00->task).sent_to = (nn_pipe *)0x0;
        goto LAB_00117a96;
      }
      if (type == 2) {
        nn_timer_stop(&(self_00->task).timer);
        (self_00->task).sent_to = (nn_pipe *)0x0;
        self_00->state = 7;
        return;
      }
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected action";
      uVar3 = 0xfffffffffffffffe;
      uVar4 = 0x1c4;
    }
    else {
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected source";
      uVar4 = 0x1d3;
    }
    goto LAB_00117e3a;
  case 5:
    if (src == -2) {
      if (type == 4) {
LAB_00117a96:
        self_00->state = 6;
        return;
      }
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected action";
      uVar3 = 0xfffffffffffffffe;
      uVar4 = 0x1ed;
      goto LAB_00117e3a;
    }
    if (src != 1) {
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected source";
      uVar4 = 0x1f1;
      goto LAB_00117e3a;
    }
    if (type != 2) {
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected action";
      uVar3 = 1;
      uVar4 = 0x1e4;
      goto LAB_00117e3a;
    }
    break;
  case 6:
    if (src == -2) {
      if (type == 4) {
        return;
      }
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected action";
      uVar3 = 0xfffffffffffffffe;
      uVar4 = 0x213;
      goto LAB_00117e3a;
    }
    if (src != 1) {
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected source";
      uVar4 = 0x217;
      goto LAB_00117e3a;
    }
    if (type != 2) {
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected action";
      uVar3 = 1;
      uVar4 = 0x206;
      goto LAB_00117e3a;
    }
    break;
  case 7:
    if (src == -2) {
      if (type == 4) goto LAB_00117a96;
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected action";
      uVar3 = 0xfffffffffffffffe;
      uVar4 = 0x231;
    }
    else if (src == 1) {
      if (type == 2) {
        self_00->state = 8;
        return;
      }
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected action";
      uVar3 = 1;
      uVar4 = 0x228;
    }
    else {
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected source";
      uVar4 = 0x235;
    }
    goto LAB_00117e3a;
  case 8:
    if (src != -2) {
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected source";
      uVar4 = 0x24c;
      goto LAB_00117e3a;
    }
    if (type != 4) {
      if (type == 5) goto LAB_001178cd;
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected action";
      uVar3 = 0xfffffffffffffffe;
      uVar4 = 0x248;
      goto LAB_00117e3a;
    }
    break;
  default:
    nn_backtrace_print();
    uVar1 = (ulong)(uint)self_00->state;
    pcVar2 = "Unexpected state";
    uVar4 = 0x253;
LAB_00117e3a:
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n",pcVar2,uVar1,uVar3,
            (ulong)(uint)type,
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
            ,uVar4);
    fflush(_stderr);
    nn_err_abort();
  }
  allow_delay = 1;
LAB_0011794a:
  nn_req_action_send(self_00,allow_delay);
  return;
}

Assistant:

void nn_req_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_req *req;

    req = nn_cont (self, struct nn_req, fsm);

    switch (req->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/*  The socket was created recently. Intermediate state.                      */
/*  Pass straight to the PASSIVE state.                                       */
/******************************************************************************/
    case NN_REQ_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                req->state = NN_REQ_STATE_PASSIVE;
                return;
            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        default:
            nn_fsm_bad_source (req->state, src, type);
        }

/******************************************************************************/
/*  PASSIVE state.                                                            */
/*  No request is submitted.                                                  */
/******************************************************************************/
    case NN_REQ_STATE_PASSIVE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_REQ_ACTION_SENT:
                nn_req_action_send (req, 1);
                return;
            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        default:
            nn_fsm_bad_source (req->state, src, type);
        }

/******************************************************************************/
/*  DELAYED state.                                                            */
/*  Request was submitted but it could not be sent to the network because     */
/*  there was no peer available at the moment. Now we are waiting for the     */
/*  peer to arrive to send the request to it.                                 */
/******************************************************************************/
    case NN_REQ_STATE_DELAYED:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_REQ_ACTION_OUT:
                nn_req_action_send (req, 0);
                return;
            case NN_REQ_ACTION_SENT:
                return;
            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        default:
            nn_fsm_bad_source (req->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/*  Request was submitted. Waiting for reply.                                 */
/******************************************************************************/
    case NN_REQ_STATE_ACTIVE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_REQ_ACTION_IN:

                /*  Reply arrived. */
                nn_timer_stop (&req->task.timer);
                req->task.sent_to = NULL;
                req->state = NN_REQ_STATE_STOPPING_TIMER;
                return;

            case NN_REQ_ACTION_SENT:

                /*  New request was sent while the old one was still being
                    processed. Cancel the old request first. */
                nn_timer_stop (&req->task.timer);
                req->task.sent_to = NULL;
                req->state = NN_REQ_STATE_CANCELLING;
                return;

            case NN_REQ_ACTION_PIPE_RM:
                /*  Pipe that we sent request to is removed  */
                nn_timer_stop (&req->task.timer);
                req->task.sent_to = NULL;
                /*  Pretend we timed out so request resent immediately  */
                req->state = NN_REQ_STATE_TIMED_OUT;
                return;

            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        case NN_REQ_SRC_RESEND_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&req->task.timer);
                req->task.sent_to = NULL;
                req->state = NN_REQ_STATE_TIMED_OUT;
                return;
            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        default:
            nn_fsm_bad_source (req->state, src, type);
        }

/******************************************************************************/
/*  TIMED_OUT state.                                                          */
/*  Waiting for reply has timed out. Stopping the timer. Afterwards, we'll    */
/*  re-send the request.                                                      */
/******************************************************************************/
    case NN_REQ_STATE_TIMED_OUT:
        switch (src) {

        case NN_REQ_SRC_RESEND_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                nn_req_action_send (req, 1);
                return;
            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        case NN_FSM_ACTION:
            switch (type) {
            case NN_REQ_ACTION_SENT:
                req->state = NN_REQ_STATE_CANCELLING;
                return;
            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        default:
            nn_fsm_bad_source (req->state, src, type);
        }

/******************************************************************************/
/*  CANCELLING state.                                                         */
/*  Request was canceled. Waiting till the timer is stopped. Note that        */
/*  cancelling is done by sending a new request. Thus there's already         */
/*  a request waiting to be sent in this state.                               */
/******************************************************************************/
    case NN_REQ_STATE_CANCELLING:
        switch (src) {

        case NN_REQ_SRC_RESEND_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:

                /*  Timer is stopped. Now we can send the delayed request. */
                nn_req_action_send (req, 1);
                return;

            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        case NN_FSM_ACTION:
             switch (type) {
             case NN_REQ_ACTION_SENT:

                 /*  No need to do anything here. Old delayed request is just
                     replaced by the new one that will be sent once the timer
                     is closed. */
                 return;

             default:
                 nn_fsm_bad_action (req->state, src, type);
             }

        default:
            nn_fsm_bad_source (req->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_TIMER state.                                                     */
/*  Reply was delivered. Waiting till the timer is stopped.                   */
/******************************************************************************/
    case NN_REQ_STATE_STOPPING_TIMER:
        switch (src) {

        case NN_REQ_SRC_RESEND_TIMER:

            switch (type) {
            case NN_TIMER_STOPPED:
                req->state = NN_REQ_STATE_DONE;
                return;
            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        case NN_FSM_ACTION:
            switch (type) {
            case NN_REQ_ACTION_SENT:
                req->state = NN_REQ_STATE_CANCELLING;
                return;
            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        default:
            nn_fsm_bad_source (req->state, src, type);
        }

/******************************************************************************/
/*  DONE state.                                                               */
/*  Reply was received but not yet retrieved by the user.                     */
/******************************************************************************/
    case NN_REQ_STATE_DONE:
        switch (src) {

        case NN_FSM_ACTION:
             switch (type) {
             case NN_REQ_ACTION_RECEIVED:
                 req->state = NN_REQ_STATE_PASSIVE;
                 return;
             case NN_REQ_ACTION_SENT:
                 nn_req_action_send (req, 1);
                 return;
             default:
                 nn_fsm_bad_action (req->state, src, type);
             }

        default:
            nn_fsm_bad_source (req->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (req->state, src, type);
    }
}